

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

bool FinalizePSBT(PartiallySignedTransaction *psbtx)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  long in_FS_OFFSET;
  uint i;
  bool complete;
  PrecomputedTransactionData txdata;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 local_140;
  undefined1 local_139;
  undefined1 in_stack_fffffffffffffedf;
  SignatureData *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffeec;
  PrecomputedTransactionData *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  PartiallySignedTransaction *in_stack_ffffffffffffff00;
  SigningProvider *in_stack_ffffffffffffff08;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_139 = true;
  PrecomputePSBTData(in_stack_ffffffffffffff00);
  local_140 = 0;
  while( true ) {
    std::optional<CMutableTransaction>::operator->
              ((optional<CMutableTransaction> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    sVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (sVar3 <= local_140) break;
    in_stack_fffffffffffffe88 = 1;
    bVar2 = SignPSBTInput(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                          in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
                          in_stack_fffffffffffffeec,in_stack_fffffffffffffee0,
                          (bool)in_stack_fffffffffffffedf);
    local_139 = (local_139 & bVar2) != 0;
    local_140 = local_140 + 1;
  }
  PrecomputedTransactionData::~PrecomputedTransactionData
            ((PrecomputedTransactionData *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_139;
  }
  __stack_chk_fail();
}

Assistant:

bool FinalizePSBT(PartiallySignedTransaction& psbtx)
{
    // Finalize input signatures -- in case we have partial signatures that add up to a complete
    //   signature, but have not combined them yet (e.g. because the combiner that created this
    //   PartiallySignedTransaction did not understand them), this will combine them into a final
    //   script.
    bool complete = true;
    const PrecomputedTransactionData txdata = PrecomputePSBTData(psbtx);
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        complete &= SignPSBTInput(DUMMY_SIGNING_PROVIDER, psbtx, i, &txdata, SIGHASH_ALL, nullptr, true);
    }

    return complete;
}